

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O3

Belief * __thiscall despot::Bridge::Tau(Bridge *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  ParticleBelief *pPVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  double local_50;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_48;
  State *local_30;
  
  if (Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') {
    iVar6 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    if (iVar6 != 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&Tau::probs,(long)BRIDGELENGTH,(allocator_type *)&local_68);
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
      __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    }
  }
  plVar7 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  pdVar9 = Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = LEFT;
  iVar5 = BRIDGELENGTH;
  iVar6 = RIGHT;
  lVar2 = *plVar7;
  lVar10 = plVar7[1] - lVar2;
  if (lVar10 == 0) {
    dVar16 = 0.0;
  }
  else {
    lVar10 = lVar10 >> 3;
    dVar16 = 0.0;
    if (obs == 1) {
      dVar14 = 1.0;
    }
    else {
      dVar14 = 0.0;
    }
    iVar1 = BRIDGELENGTH + -1;
    lVar11 = 0;
    do {
      lVar3 = *(long *)(lVar2 + lVar11 * 8);
      iVar12 = *(int *)(lVar3 + 0x20);
      if (iVar4 == action) {
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        iVar12 = iVar12 + -1;
LAB_00105ced:
        dVar15 = *(double *)(lVar3 + 0x18) * dVar14;
        dVar16 = dVar16 + dVar15;
        pdVar9[iVar12] = dVar15 + pdVar9[iVar12];
      }
      else {
        if (iVar6 != action) goto LAB_00105ced;
        if (iVar12 < iVar1) {
          iVar12 = iVar12 + 1;
          goto LAB_00105ced;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
  }
  local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < iVar5) {
    uVar13 = 0;
    pdVar9 = Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = dVar16;
    do {
      if (0.0 < pdVar9[uVar13]) {
        local_30 = (State *)(**(code **)(*(long *)this + 0xa8))(0,this,uVar13 & 0xffffffff);
        *(int *)(local_30 + 0x20) = (int)uVar13;
        *(double *)(local_30 + 0x18) =
             Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13] / local_50;
        std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)&local_68,&local_30);
        pdVar9 = Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = 0.0;
        iVar5 = BRIDGELENGTH;
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)iVar5);
  }
  pPVar8 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_48,&local_68);
  despot::ParticleBelief::ParticleBelief(pPVar8,&local_48,this,0,0);
  if (local_48.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)pPVar8;
}

Assistant:

Belief* Bridge::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		BridgeState* state = static_cast<BridgeState*>(particles[i]);
		int next_pos = state->position;
		if (action == LEFT) {
			next_pos--;
			if (next_pos < 0)
				next_pos = 0;
		} else if (action == RIGHT) {
			if (next_pos < BRIDGELENGTH - 1)
				next_pos++;
			else
				continue;
		}

		double p = state->weight * (obs == 1);
		probs[next_pos] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			BridgeState* new_particle = static_cast<BridgeState*>(Allocate(i));
			new_particle->position = i;
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}